

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::getMaxIndexes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  int iVar1;
  value_type vVar2;
  size_t sVar3;
  int *piVar4;
  reference pvVar5;
  size_type local_80;
  size_t j_1;
  size_t j;
  int *p;
  allocator<int> local_5d;
  int i;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> local_max_index;
  int n;
  allocator<int> local_29;
  value_type_conflict3 local_28;
  undefined1 local_21;
  size_t local_20;
  size_t num_dimensions;
  MultiIndexSet *mset_local;
  vector<int,_std::allocator<int>_> *max_index;
  
  num_dimensions = (size_t)mset;
  mset_local = (MultiIndexSet *)__return_storage_ptr__;
  sVar3 = MultiIndexSet::getNumDimensions(mset);
  local_21 = 0;
  local_28 = 0;
  local_20 = sVar3;
  ::std::allocator<int>::allocator(&local_29);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,sVar3,&local_28,&local_29);
  ::std::allocator<int>::~allocator(&local_29);
  local_max_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = MultiIndexSet::getNumIndexes((MultiIndexSet *)num_dimensions);
  sVar3 = local_20;
  i = 0;
  ::std::allocator<int>::allocator(&local_5d);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,sVar3,&i,&local_5d);
  ::std::allocator<int>::~allocator(&local_5d);
  for (p._4_4_ = 0;
      p._4_4_ < (int)local_max_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; p._4_4_ = p._4_4_ + 1) {
    piVar4 = MultiIndexSet::getIndex((MultiIndexSet *)num_dimensions,p._4_4_);
    for (j_1 = 0; j_1 < local_20; j_1 = j_1 + 1) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_58,j_1);
      if (*pvVar5 < piVar4[j_1]) {
        iVar1 = piVar4[j_1];
        pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,j_1);
        *pvVar5 = iVar1;
      }
    }
  }
  for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,local_80);
    iVar1 = *pvVar5;
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_58,local_80);
    if (iVar1 < *pvVar5) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_58,local_80);
      vVar2 = *pvVar5;
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,local_80);
      *pvVar5 = vVar2;
    }
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getMaxIndexes(const MultiIndexSet &mset){
    size_t num_dimensions = mset.getNumDimensions();
    std::vector<int> max_index(num_dimensions, 0);
    int n = mset.getNumIndexes();

    #pragma omp parallel
    {
        std::vector<int> local_max_index(num_dimensions, 0);
        #pragma omp for
        for(int i=0; i<n; i++){
            const int* p = mset.getIndex(i);
            for(size_t j=0; j<num_dimensions; j++) if (local_max_index[j] < p[j]) local_max_index[j] = p[j];
        }
        #pragma omp critical
        {
            for(size_t j=0; j<num_dimensions; j++){
                if (max_index[j] < local_max_index[j]) max_index[j] = local_max_index[j];
            }
        }
    }

    return max_index;
}